

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O3

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,
                 monster_conflict *mon)

{
  mon_spell_info *pmVar1;
  short sVar2;
  char *pcVar3;
  _Bool _Var4;
  _Bool _Var5;
  bool bVar6;
  uint flag;
  uint32_t uVar7;
  int iVar8;
  int flag_00;
  timed_failure *ptVar9;
  size_t size;
  bitflag *flags_00;
  monster_spell **ppmVar10;
  effect *peVar11;
  mon_spell_info *pmVar12;
  
  _Var4 = monster_is_smart((monster *)mon);
  iVar8 = 0x19;
  if (_Var4) {
    iVar8 = 0x32;
  }
  pmVar12 = mon_spell_types;
  flag = 0;
  do {
    ppmVar10 = &monster_spells;
    do {
      ppmVar10 = &((monster_spell *)ppmVar10)->next->next;
      if ((monster_spell *)ppmVar10 == (monster_spell *)0x0) goto LAB_001775f8;
    } while (((monster_spell *)ppmVar10)->index != (uint16_t)flag);
    _Var5 = flag_has_dbg(spells,0xc,flag,"spells","info->index");
    if (_Var5) {
      peVar11 = ((monster_spell *)ppmVar10)->effect;
      if ((pmVar12->type & 7) == 0) {
        for (; peVar11 != (effect *)0x0; peVar11 = peVar11->next) {
          if ((_Var4) || (uVar7 = Rand_div(3), uVar7 != 0)) {
            if (peVar11->index == 10) {
              if (0x34 < (ulong)(uint)peVar11->subtype) {
                __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-spell.c"
                              ,0x1f8,
                              "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                             );
              }
              ptVar9 = timed_effects[(uint)peVar11->subtype].fail;
LAB_0017765e:
              if (ptVar9 != (timed_failure *)0x0) {
                do {
                  switch(ptVar9->code) {
                  case 1:
                    flag_00 = ptVar9->idx;
                    size = 5;
                    pcVar3 = "save str flags";
                    flags_00 = flags;
                    goto LAB_001776ab;
                  case 2:
                    bVar6 = 0 < el[ptVar9->idx].res_level;
                    break;
                  case 3:
                    bVar6 = SUB21((ushort)el[ptVar9->idx].res_level >> 0xf,0);
                    break;
                  case 4:
                    flag_00 = ptVar9->idx;
                    size = 3;
                    pcVar3 = "p->state.pflags";
                    flags_00 = pflags;
LAB_001776ab:
                    bVar6 = flag_has_dbg(flags_00,size,flag_00,pcVar3 + 9,"f->idx");
                    break;
                  default:
                    goto switchD_00177674_default;
                  }
                  ptVar9 = ptVar9->next;
                  if ((ptVar9 == (timed_failure *)0x0) || (bVar6 != false)) {
                    if (bVar6 != false) goto LAB_001775e5;
                    break;
                  }
                } while( true );
              }
            }
            if (!_Var4) goto LAB_001776e9;
LAB_001776fb:
            if ((peVar11->index == 0x17) &&
               (_Var5 = flag_has_dbg(pflags,3,10,"pflags","PF_NO_MANA"), _Var5)) goto LAB_001775e5;
          }
          else {
LAB_001776e9:
            uVar7 = Rand_div(2);
            if (uVar7 == 0) goto LAB_001776fb;
          }
        }
      }
      else {
        sVar2 = el[peVar11->subtype].res_level;
        uVar7 = Rand_div(100);
        if ((int)uVar7 < sVar2 * iVar8) {
LAB_001775e5:
          flag_off(spells,0xc,flag);
        }
      }
    }
LAB_001775f8:
    pmVar1 = pmVar12 + 1;
    flag = (uint)pmVar1->index;
    pmVar12 = pmVar12 + 1;
    if (0x5b < pmVar1->index) {
      return;
    }
  } while( true );
switchD_00177674_default:
  ptVar9 = ptVar9->next;
  goto LAB_0017765e;
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int learn_chance = el[element].res_level * (smart ? 50 : 25);
			if (randint0(100) < learn_chance) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level > 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level < 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}
}